

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  undefined4 uVar1;
  ostream *poVar2;
  char local_1b [3];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  local_1b[0] = '(';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_1b,1);
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 0x10;
  poVar2 = std::ostream::_M_insert<double>(P->theta_);
  local_1b[1] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1b + 1,1);
  poVar2 = std::ostream::_M_insert<double>(P->beta_);
  local_1b[2] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1b + 2,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const param_type &P) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << std::setprecision(math::numeric_limits<float_t>::digits10 + 1)
            << P.theta() << ' ' << P.beta() << ')';
        out.flags(flags);
        return out;
      }